

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_ssse3.c
# Opt level: O3

uint aom_highbd_masked_sad64x16_ssse3
               (uint8_t *src8,int src_stride,uint8_t *ref8,int ref_stride,uint8_t *second_pred8,
               uint8_t *msk,int msk_stride,int invert_mask)

{
  undefined2 *puVar1;
  ulong uVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  unkuint9 Var20;
  undefined1 auVar21 [11];
  undefined1 auVar22 [15];
  undefined1 auVar23 [11];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  long lVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ushort uVar36;
  undefined1 uVar42;
  short sVar41;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  undefined1 auVar45 [16];
  undefined1 auVar49 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar58 [16];
  undefined1 auVar53 [16];
  undefined1 auVar59 [16];
  
  lVar29 = (long)src8 * 2;
  if (invert_mask == 0) {
    lVar28 = (long)second_pred8 * 2;
    lVar30 = (long)ref8 * 2;
    iVar31 = 0;
    auVar33 = (undefined1  [16])0x0;
    do {
      uVar32 = 0xfffffffffffffff8;
      auVar34 = auVar33;
      do {
        auVar33 = *(undefined1 (*) [16])(lVar29 + 0x10 + uVar32 * 2);
        auVar38 = *(undefined1 (*) [16])(lVar30 + 0x10 + uVar32 * 2);
        puVar1 = (undefined2 *)(lVar28 + 0x10 + uVar32 * 2);
        uVar2 = *(ulong *)(msk + uVar32 + 8);
        uVar42 = (undefined1)(uVar2 >> 0x38);
        auVar4._8_6_ = 0;
        auVar4._0_8_ = uVar2;
        auVar4[0xe] = uVar42;
        auVar6._8_4_ = 0;
        auVar6._0_8_ = uVar2;
        auVar6[0xc] = (char)(uVar2 >> 0x30);
        auVar6._13_2_ = auVar4._13_2_;
        auVar8._8_4_ = 0;
        auVar8._0_8_ = uVar2;
        auVar8._12_3_ = auVar6._12_3_;
        auVar10._8_2_ = 0;
        auVar10._0_8_ = uVar2;
        auVar10[10] = (char)(uVar2 >> 0x28);
        auVar10._11_4_ = auVar8._11_4_;
        auVar12._8_2_ = 0;
        auVar12._0_8_ = uVar2;
        auVar12._10_5_ = auVar10._10_5_;
        auVar14[8] = (char)(uVar2 >> 0x20);
        auVar14._0_8_ = uVar2;
        auVar14._9_6_ = auVar12._9_6_;
        auVar22._7_8_ = 0;
        auVar22._0_7_ = auVar14._8_7_;
        Var20 = CONCAT81(SUB158(auVar22 << 0x40,7),(char)(uVar2 >> 0x18));
        auVar26._9_6_ = 0;
        auVar26._0_9_ = Var20;
        auVar23._1_10_ = SUB1510(auVar26 << 0x30,5);
        auVar23[0] = (char)(uVar2 >> 0x10);
        auVar27._11_4_ = 0;
        auVar27._0_11_ = auVar23;
        uVar36 = (ushort)uVar2;
        auVar16[2] = (char)(uVar2 >> 8);
        auVar16._0_2_ = uVar36;
        auVar16._3_12_ = SUB1512(auVar27 << 0x20,3);
        auVar18._2_13_ = auVar16._2_13_;
        auVar18._0_2_ = uVar36 & 0xff;
        sVar41 = (short)Var20;
        auVar50._0_12_ = auVar38._0_12_;
        auVar50._12_2_ = auVar38._6_2_;
        auVar50._14_2_ = puVar1[3];
        auVar49._12_4_ = auVar50._12_4_;
        auVar49._0_10_ = auVar38._0_10_;
        auVar49._10_2_ = puVar1[2];
        auVar48._10_6_ = auVar49._10_6_;
        auVar48._0_8_ = auVar38._0_8_;
        auVar48._8_2_ = auVar38._4_2_;
        auVar47._8_8_ = auVar48._8_8_;
        auVar47._6_2_ = puVar1[1];
        auVar47._4_2_ = auVar38._2_2_;
        auVar47._0_2_ = auVar38._0_2_;
        auVar47._2_2_ = *puVar1;
        auVar59._0_12_ = auVar18._0_12_;
        auVar59._12_2_ = sVar41;
        auVar59._14_2_ = 0x40 - sVar41;
        auVar58._12_4_ = auVar59._12_4_;
        auVar58._0_10_ = auVar18._0_10_;
        auVar58._10_2_ = 0x40 - auVar23._0_2_;
        auVar57._10_6_ = auVar58._10_6_;
        auVar57._8_2_ = auVar23._0_2_;
        auVar57._6_2_ = 0x40 - auVar16._2_2_;
        auVar57._4_2_ = auVar16._2_2_;
        auVar57._0_4_ = CONCAT22(0x40 - (uVar36 & 0xff),uVar36) & 0xffff00ff;
        auVar54 = pmaddwd(auVar57,auVar47);
        auVar60._0_4_ = auVar54._0_4_ + 0x20 >> 6;
        auVar60._4_4_ = auVar54._4_4_ + 0x20 >> 6;
        auVar60._8_4_ = auVar54._8_4_ + 0x20 >> 6;
        auVar60._12_4_ = auVar54._12_4_ + 0x20 >> 6;
        auVar54._2_2_ = puVar1[4];
        auVar54._0_2_ = auVar38._8_2_;
        auVar54._4_2_ = auVar38._10_2_;
        auVar54._6_2_ = puVar1[5];
        auVar54._8_2_ = auVar38._12_2_;
        auVar54._10_2_ = puVar1[6];
        auVar54._12_2_ = auVar38._14_2_;
        auVar54._14_2_ = puVar1[7];
        auVar38._2_2_ = 0x40 - auVar14._8_2_;
        auVar38._0_2_ = auVar14._8_2_;
        auVar38._4_2_ = auVar10._10_2_;
        auVar38._6_2_ = 0x40 - auVar10._10_2_;
        auVar38._8_2_ = auVar6._12_2_;
        auVar38._10_2_ = 0x40 - auVar6._12_2_;
        auVar38[0xc] = uVar42;
        auVar38[0xd] = 0;
        auVar38._14_2_ = 0x40 - (auVar4._13_2_ >> 8);
        auVar38 = pmaddwd(auVar38,auVar54);
        auVar40._0_4_ = auVar38._0_4_ + 0x20 >> 6;
        auVar40._4_4_ = auVar38._4_4_ + 0x20 >> 6;
        auVar40._8_4_ = auVar38._8_4_ + 0x20 >> 6;
        auVar40._12_4_ = auVar38._12_4_ + 0x20 >> 6;
        auVar38 = packssdw(auVar60,auVar40);
        auVar61._0_2_ = auVar38._0_2_ - auVar33._0_2_;
        auVar61._2_2_ = auVar38._2_2_ - auVar33._2_2_;
        auVar61._4_2_ = auVar38._4_2_ - auVar33._4_2_;
        auVar61._6_2_ = auVar38._6_2_ - auVar33._6_2_;
        auVar61._8_2_ = auVar38._8_2_ - auVar33._8_2_;
        auVar61._10_2_ = auVar38._10_2_ - auVar33._10_2_;
        auVar61._12_2_ = auVar38._12_2_ - auVar33._12_2_;
        auVar61._14_2_ = auVar38._14_2_ - auVar33._14_2_;
        auVar33 = pabsw(auVar33,auVar61);
        auVar38 = pmaddwd(auVar33,_DAT_0050d500);
        auVar33._0_4_ = auVar34._0_4_ + auVar38._0_4_;
        auVar33._4_4_ = auVar34._4_4_ + auVar38._4_4_;
        auVar33._8_4_ = auVar34._8_4_ + auVar38._8_4_;
        auVar33._12_4_ = auVar34._12_4_ + auVar38._12_4_;
        uVar32 = uVar32 + 8;
        auVar34 = auVar33;
      } while (uVar32 < 0x38);
      lVar28 = lVar28 + 0x80;
      msk = msk + msk_stride;
      iVar31 = iVar31 + 1;
      lVar30 = lVar30 + (long)ref_stride * 2;
      lVar29 = lVar29 + (long)src_stride * 2;
    } while (iVar31 != 0x10);
  }
  else {
    lVar28 = (long)ref8 * 2;
    lVar30 = (long)second_pred8 * 2;
    iVar31 = 0;
    auVar33 = (undefined1  [16])0x0;
    do {
      uVar32 = 0xfffffffffffffff8;
      auVar34 = auVar33;
      do {
        auVar33 = *(undefined1 (*) [16])(lVar29 + 0x10 + uVar32 * 2);
        auVar38 = *(undefined1 (*) [16])(lVar30 + 0x10 + uVar32 * 2);
        puVar1 = (undefined2 *)(lVar28 + 0x10 + uVar32 * 2);
        uVar2 = *(ulong *)(msk + uVar32 + 8);
        uVar42 = (undefined1)(uVar2 >> 0x38);
        auVar3._8_6_ = 0;
        auVar3._0_8_ = uVar2;
        auVar3[0xe] = uVar42;
        auVar5._8_4_ = 0;
        auVar5._0_8_ = uVar2;
        auVar5[0xc] = (char)(uVar2 >> 0x30);
        auVar5._13_2_ = auVar3._13_2_;
        auVar7._8_4_ = 0;
        auVar7._0_8_ = uVar2;
        auVar7._12_3_ = auVar5._12_3_;
        auVar9._8_2_ = 0;
        auVar9._0_8_ = uVar2;
        auVar9[10] = (char)(uVar2 >> 0x28);
        auVar9._11_4_ = auVar7._11_4_;
        auVar11._8_2_ = 0;
        auVar11._0_8_ = uVar2;
        auVar11._10_5_ = auVar9._10_5_;
        auVar13[8] = (char)(uVar2 >> 0x20);
        auVar13._0_8_ = uVar2;
        auVar13._9_6_ = auVar11._9_6_;
        auVar19._7_8_ = 0;
        auVar19._0_7_ = auVar13._8_7_;
        Var20 = CONCAT81(SUB158(auVar19 << 0x40,7),(char)(uVar2 >> 0x18));
        auVar24._9_6_ = 0;
        auVar24._0_9_ = Var20;
        auVar21._1_10_ = SUB1510(auVar24 << 0x30,5);
        auVar21[0] = (char)(uVar2 >> 0x10);
        auVar25._11_4_ = 0;
        auVar25._0_11_ = auVar21;
        uVar36 = (ushort)uVar2;
        auVar15[2] = (char)(uVar2 >> 8);
        auVar15._0_2_ = uVar36;
        auVar15._3_12_ = SUB1512(auVar25 << 0x20,3);
        auVar17._2_13_ = auVar15._2_13_;
        auVar17._0_2_ = uVar36 & 0xff;
        sVar41 = (short)Var20;
        auVar46._0_12_ = auVar38._0_12_;
        auVar46._12_2_ = auVar38._6_2_;
        auVar46._14_2_ = puVar1[3];
        auVar45._12_4_ = auVar46._12_4_;
        auVar45._0_10_ = auVar38._0_10_;
        auVar45._10_2_ = puVar1[2];
        auVar44._10_6_ = auVar45._10_6_;
        auVar44._0_8_ = auVar38._0_8_;
        auVar44._8_2_ = auVar38._4_2_;
        auVar43._8_8_ = auVar44._8_8_;
        auVar43._6_2_ = puVar1[1];
        auVar43._4_2_ = auVar38._2_2_;
        auVar43._0_2_ = auVar38._0_2_;
        auVar43._2_2_ = *puVar1;
        auVar53._0_12_ = auVar17._0_12_;
        auVar53._12_2_ = sVar41;
        auVar53._14_2_ = 0x40 - sVar41;
        auVar52._12_4_ = auVar53._12_4_;
        auVar52._0_10_ = auVar17._0_10_;
        auVar52._10_2_ = 0x40 - auVar21._0_2_;
        auVar51._10_6_ = auVar52._10_6_;
        auVar51._8_2_ = auVar21._0_2_;
        auVar51._6_2_ = 0x40 - auVar15._2_2_;
        auVar51._4_2_ = auVar15._2_2_;
        auVar51._0_4_ = CONCAT22(0x40 - (uVar36 & 0xff),uVar36) & 0xffff00ff;
        auVar54 = pmaddwd(auVar51,auVar43);
        auVar55._0_4_ = auVar54._0_4_ + 0x20 >> 6;
        auVar55._4_4_ = auVar54._4_4_ + 0x20 >> 6;
        auVar55._8_4_ = auVar54._8_4_ + 0x20 >> 6;
        auVar55._12_4_ = auVar54._12_4_ + 0x20 >> 6;
        auVar35._2_2_ = puVar1[4];
        auVar35._0_2_ = auVar38._8_2_;
        auVar35._4_2_ = auVar38._10_2_;
        auVar35._6_2_ = puVar1[5];
        auVar35._8_2_ = auVar38._12_2_;
        auVar35._10_2_ = puVar1[6];
        auVar35._12_2_ = auVar38._14_2_;
        auVar35._14_2_ = puVar1[7];
        auVar37._2_2_ = 0x40 - auVar13._8_2_;
        auVar37._0_2_ = auVar13._8_2_;
        auVar37._4_2_ = auVar9._10_2_;
        auVar37._6_2_ = 0x40 - auVar9._10_2_;
        auVar37._8_2_ = auVar5._12_2_;
        auVar37._10_2_ = 0x40 - auVar5._12_2_;
        auVar37[0xc] = uVar42;
        auVar37[0xd] = 0;
        auVar37._14_2_ = 0x40 - (auVar3._13_2_ >> 8);
        auVar38 = pmaddwd(auVar37,auVar35);
        auVar39._0_4_ = auVar38._0_4_ + 0x20 >> 6;
        auVar39._4_4_ = auVar38._4_4_ + 0x20 >> 6;
        auVar39._8_4_ = auVar38._8_4_ + 0x20 >> 6;
        auVar39._12_4_ = auVar38._12_4_ + 0x20 >> 6;
        auVar38 = packssdw(auVar55,auVar39);
        auVar56._0_2_ = auVar38._0_2_ - auVar33._0_2_;
        auVar56._2_2_ = auVar38._2_2_ - auVar33._2_2_;
        auVar56._4_2_ = auVar38._4_2_ - auVar33._4_2_;
        auVar56._6_2_ = auVar38._6_2_ - auVar33._6_2_;
        auVar56._8_2_ = auVar38._8_2_ - auVar33._8_2_;
        auVar56._10_2_ = auVar38._10_2_ - auVar33._10_2_;
        auVar56._12_2_ = auVar38._12_2_ - auVar33._12_2_;
        auVar56._14_2_ = auVar38._14_2_ - auVar33._14_2_;
        auVar33 = pabsw(auVar33,auVar56);
        auVar38 = pmaddwd(auVar33,_DAT_0050d500);
        auVar33._0_4_ = auVar34._0_4_ + auVar38._0_4_;
        auVar33._4_4_ = auVar34._4_4_ + auVar38._4_4_;
        auVar33._8_4_ = auVar34._8_4_ + auVar38._8_4_;
        auVar33._12_4_ = auVar34._12_4_ + auVar38._12_4_;
        uVar32 = uVar32 + 8;
        auVar34 = auVar33;
      } while (uVar32 < 0x38);
      lVar30 = lVar30 + 0x80;
      msk = msk + msk_stride;
      iVar31 = iVar31 + 1;
      lVar28 = lVar28 + (long)ref_stride * 2;
      lVar29 = lVar29 + (long)src_stride * 2;
    } while (iVar31 != 0x10);
  }
  auVar33 = phaddd(auVar33,auVar33);
  auVar33 = phaddd(auVar33,auVar33);
  return auVar33._0_4_;
}

Assistant:

static inline unsigned int highbd_masked_sad_ssse3(
    const uint8_t *src8, int src_stride, const uint8_t *a8, int a_stride,
    const uint8_t *b8, int b_stride, const uint8_t *m_ptr, int m_stride,
    int width, int height) {
  const uint16_t *src_ptr = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *a_ptr = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b_ptr = CONVERT_TO_SHORTPTR(b8);
  int x, y;
  __m128i res = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m128i round_const =
      _mm_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m128i one = _mm_set1_epi16(1);

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x += 8) {
      const __m128i src = _mm_loadu_si128((const __m128i *)&src_ptr[x]);
      const __m128i a = _mm_loadu_si128((const __m128i *)&a_ptr[x]);
      const __m128i b = _mm_loadu_si128((const __m128i *)&b_ptr[x]);
      // Zero-extend mask to 16 bits
      const __m128i m = _mm_unpacklo_epi8(
          _mm_loadl_epi64((const __m128i *)&m_ptr[x]), _mm_setzero_si128());
      const __m128i m_inv = _mm_sub_epi16(mask_max, m);

      const __m128i data_l = _mm_unpacklo_epi16(a, b);
      const __m128i mask_l = _mm_unpacklo_epi16(m, m_inv);
      __m128i pred_l = _mm_madd_epi16(data_l, mask_l);
      pred_l = _mm_srai_epi32(_mm_add_epi32(pred_l, round_const),
                              AOM_BLEND_A64_ROUND_BITS);

      const __m128i data_r = _mm_unpackhi_epi16(a, b);
      const __m128i mask_r = _mm_unpackhi_epi16(m, m_inv);
      __m128i pred_r = _mm_madd_epi16(data_r, mask_r);
      pred_r = _mm_srai_epi32(_mm_add_epi32(pred_r, round_const),
                              AOM_BLEND_A64_ROUND_BITS);

      // Note: the maximum value in pred_l/r is (2^bd)-1 < 2^15,
      // so it is safe to do signed saturation here.
      const __m128i pred = _mm_packs_epi32(pred_l, pred_r);
      // There is no 16-bit SAD instruction, so we have to synthesize
      // an 8-element SAD. We do this by storing 4 32-bit partial SADs,
      // and accumulating them at the end
      const __m128i diff = _mm_abs_epi16(_mm_sub_epi16(pred, src));
      res = _mm_add_epi32(res, _mm_madd_epi16(diff, one));
    }

    src_ptr += src_stride;
    a_ptr += a_stride;
    b_ptr += b_stride;
    m_ptr += m_stride;
  }
  // At this point, we have four 32-bit partial SADs stored in 'res'.
  res = _mm_hadd_epi32(res, res);
  res = _mm_hadd_epi32(res, res);
  int sad = _mm_cvtsi128_si32(res);
  return sad;
}